

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.hpp
# Opt level: O1

Vector<float,_4> __thiscall
rr::readLineVarying<float>
          (rr *this,FragmentPacket *packet,FragmentShadingContext *context,int varyingLoc,
          int fragNdx)

{
  float fVar1;
  Vector<float,_4> *res_2;
  long lVar2;
  Vector<float,_4> VVar3;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  fVar1 = packet->barycentric[0].m_data[fragNdx];
  local_10 = *(undefined8 *)&context->varyings[0][varyingLoc].v;
  uStack_8 = *(undefined8 *)((long)&context->varyings[0][varyingLoc].v + 8);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = *(float *)((long)&local_10 + lVar2 * 4) * fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar1 = packet->barycentric[1].m_data[fragNdx];
  local_20 = *(undefined8 *)&context->varyings[1][varyingLoc].v;
  uStack_18 = *(undefined8 *)((long)&context->varyings[1][varyingLoc].v + 8);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    VVar3.m_data[2] = *(float *)((long)&local_20 + lVar2 * 4) * fVar1;
    res_1.m_data[lVar2] = VVar3.m_data[2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar2 = 0;
  do {
    VVar3.m_data[0] = res.m_data[lVar2] + res_1.m_data[lVar2];
    *(float *)(this + lVar2 * 4) = VVar3.m_data[0];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  VVar3.m_data[1] = 0.0;
  VVar3.m_data[3] = 0.0;
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

tcu::Vector<T, 4> readLineVarying (const FragmentPacket& packet, const FragmentShadingContext& context, int varyingLoc, int fragNdx)
{
	return   packet.barycentric[0][fragNdx] * context.varyings[0][varyingLoc].get<T>()
		   + packet.barycentric[1][fragNdx] * context.varyings[1][varyingLoc].get<T>();
}